

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

int __thiscall
icu_63::DecimalFormat::clone
          (DecimalFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DecimalFormat *this_00;
  undefined8 local_30;
  DecimalFormat *this_local;
  
  this_00 = (DecimalFormat *)UMemory::operator_new((UMemory *)0x170,(size_t)__fn);
  local_30 = (DecimalFormat *)0x0;
  if (this_00 != (DecimalFormat *)0x0) {
    DecimalFormat(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Format* DecimalFormat::clone() const {
    return new DecimalFormat(*this);
}